

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::CodemodelConfig::DumpTarget
          (Value *__return_storage_ptr__,CodemodelConfig *this,cmGeneratorTarget *gt,ArrayIndex ti)

{
  cmFileAPI *this_00;
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  Value *pVVar4;
  cmLocalGenerator *lg;
  reference pvVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  Value local_4c0;
  Value local_498;
  UInt local_46c;
  undefined1 local_468 [4];
  ArrayIndex pi;
  Value local_440;
  ArrayIndex local_414;
  undefined1 local_410 [4];
  ArrayIndex di;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  undefined1 local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  reference local_350;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_320 [8];
  string prefix;
  Target t;
  cmGeneratorTarget *pcStack_20;
  ArrayIndex ti_local;
  cmGeneratorTarget *gt_local;
  CodemodelConfig *this_local;
  Value *target;
  
  pcStack_20 = gt;
  gt_local = (cmGeneratorTarget *)this;
  this_local = (CodemodelConfig *)__return_storage_ptr__;
  Target::Target((Target *)((long)&prefix.field_2 + 8),gt,this->Config);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                 "target-",psVar2);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    local_350 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1);
    if ((*local_350 == '/') || (*local_350 == '\\')) {
      *local_350 = '_';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_370,"-",this->Config);
    std::__cxx11::string::operator+=((string *)local_320,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
  }
  local_371 = 0;
  this_00 = this->FileAPI;
  Target::Dump(&local_3a0,(Target *)((long)&prefix.field_2 + 8));
  cmFileAPI::MaybeJsonFile(__return_storage_ptr__,this_00,&local_3a0,(string *)local_320);
  Json::Value::~Value(&local_3a0);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_20);
  Json::Value::Value(&local_3c8,psVar2);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar4,&local_3c8);
  Json::Value::~Value(&local_3c8);
  TargetId((string *)local_410,pcStack_20,&this->TopBuild);
  Json::Value::Value(&local_3f0,(String *)local_410);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar4,&local_3f0);
  Json::Value::~Value(&local_3f0);
  std::__cxx11::string::~string((string *)local_410);
  lg = cmGeneratorTarget::GetLocalGenerator(pcStack_20);
  local_414 = GetDirectoryIndex(this,lg);
  Json::Value::Value(&local_440,local_414);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"directoryIndex");
  Json::Value::operator=(pVVar4,&local_440);
  Json::Value::~Value(&local_440);
  pvVar5 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
           ::operator[](&this->Directories,(ulong)local_414);
  Json::Value::Value((Value *)local_468,ti);
  Json::Value::append(&pvVar5->TargetIndexes,(Value *)local_468);
  Json::Value::~Value((Value *)local_468);
  pvVar5 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
           ::operator[](&this->Directories,(ulong)local_414);
  local_46c = pvVar5->ProjectIndex;
  Json::Value::Value(&local_498,local_46c);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"projectIndex");
  Json::Value::operator=(pVVar4,&local_498);
  Json::Value::~Value(&local_498);
  pvVar6 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
           ::operator[](&this->Projects,(ulong)local_46c);
  Json::Value::Value(&local_4c0,ti);
  Json::Value::append(&pvVar6->TargetIndexes,&local_4c0);
  Json::Value::~Value(&local_4c0);
  pmVar7 = std::
           unordered_map<const_cmGeneratorTarget_*,_unsigned_int,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>_>
           ::operator[](&this->TargetIndexMap,&stack0xffffffffffffffe0);
  *pmVar7 = ti;
  local_371 = 1;
  std::__cxx11::string::~string((string *)local_320);
  Target::~Target((Target *)((long)&prefix.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpTarget(cmGeneratorTarget* gt,
                                        Json::ArrayIndex ti)
{
  Target t(gt, this->Config);
  std::string prefix = "target-" + gt->GetName();
  for (char& c : prefix) {
    // CMP0037 OLD behavior allows slashes in target names.  Remove them.
    if (c == '/' || c == '\\') {
      c = '_';
    }
  }
  if (!this->Config.empty()) {
    prefix += "-" + this->Config;
  }
  Json::Value target = this->FileAPI.MaybeJsonFile(t.Dump(), prefix);
  target["name"] = gt->GetName();
  target["id"] = TargetId(gt, this->TopBuild);

  // Cross-reference directory containing target.
  Json::ArrayIndex di = this->GetDirectoryIndex(gt->GetLocalGenerator());
  target["directoryIndex"] = di;
  this->Directories[di].TargetIndexes.append(ti);

  // Cross-reference project containing target.
  Json::ArrayIndex pi = this->Directories[di].ProjectIndex;
  target["projectIndex"] = pi;
  this->Projects[pi].TargetIndexes.append(ti);

  this->TargetIndexMap[gt] = ti;

  return target;
}